

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_false>::parse_wconv
                   (char_t *s,char_t end_quote)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *__src;
  long lVar4;
  bool bVar5;
  
  __src = (byte *)0x0;
  lVar4 = 0;
  do {
    pbVar3 = (byte *)s;
    if (((anonymous_namespace)::chartype_table[*pbVar3] & 4) == 0) {
      if (((anonymous_namespace)::chartype_table[pbVar3[1]] & 4) != 0) {
        pbVar3 = pbVar3 + 1;
        goto LAB_0033151c;
      }
      if (((anonymous_namespace)::chartype_table[pbVar3[2]] & 4) != 0) {
        pbVar3 = pbVar3 + 2;
        goto LAB_0033151c;
      }
      bVar5 = ((anonymous_namespace)::chartype_table[pbVar3[3]] & 4) == 0;
      if (bVar5) {
        pbVar3 = pbVar3 + 4;
      }
      else {
        pbVar3 = pbVar3 + 3;
      }
    }
    else {
LAB_0033151c:
      bVar5 = false;
    }
    s = (char_t *)pbVar3;
    if (!bVar5) {
      bVar1 = *pbVar3;
      if (bVar1 == end_quote) {
        pbVar2 = pbVar3;
        if (__src != (byte *)0x0) {
          memmove(__src + -lVar4,__src,(long)pbVar3 - (long)__src);
          pbVar2 = pbVar3 + -lVar4;
        }
        *pbVar2 = 0;
        return (char_t *)(pbVar3 + 1);
      }
      if (((anonymous_namespace)::chartype_table[bVar1] & 8) == 0) {
        if ((ulong)bVar1 == 0) {
          return (char_t *)0x0;
        }
        s = (char_t *)(pbVar3 + 1);
      }
      else {
        s = (char_t *)(pbVar3 + 1);
        *pbVar3 = 0x20;
        if ((bVar1 == 0xd) && (*s == 10)) {
          if (__src != (byte *)0x0) {
            memmove(__src + -lVar4,__src,(long)s - (long)__src);
          }
          __src = pbVar3 + 2;
          lVar4 = lVar4 + 1;
          s = (char_t *)__src;
        }
      }
    }
  } while( true );
}

Assistant:

static char_t* parse_wconv(char_t* s, char_t end_quote)
		{
			gap g;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_attr_ws));

				if (*s == end_quote)
				{
					*g.flush(s) = 0;

					return s + 1;
				}
				else if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
				{
					if (*s == '\r')
					{
						*s++ = ' ';

						if (*s == '\n') g.push(s, 1);
					}
					else *s++ = ' ';
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return NULL;
				}
				else ++s;
			}
		}